

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O3

TRef fold_simplify_intmul_k64(jit_State *J)

{
  ulong uVar1;
  TRef TVar2;
  cTValue *tv;
  
  uVar1 = *(ulong *)(ulong)(J->fold).right.field_1.op12;
  if (uVar1 == 0) {
    tv = lj_ir_k64_find(J,0);
    TVar2 = lj_ir_k64(J,IR_KINT64,tv);
    return TVar2;
  }
  if (uVar1 < 0x80000000) {
    TVar2 = simplify_intmul_k(J,(int32_t)uVar1);
    return TVar2;
  }
  return 0;
}

Assistant:

LJFOLD(MUL any KINT64)
LJFOLDF(simplify_intmul_k64)
{
  if (ir_kint64(fright)->u64 == 0)  /* i * 0 ==> 0 */
    return INT64FOLD(0);
#if LJ_64
  /* NYI: SPLIT for BSHL and 32 bit backend support. */
  else if (ir_kint64(fright)->u64 < 0x80000000u)
    return simplify_intmul_k(J, (int32_t)ir_kint64(fright)->u64);
#endif
  return NEXTFOLD;
}